

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool openjtalk_speakToFileU16(OpenJTalk *oj,char16_t *text,char16_t *file)

{
  char16_t *pcVar1;
  SpeakData *pSVar2;
  _Bool _Var3;
  long lVar4;
  char *pcVar5;
  FILE *__stream;
  char pathU8 [260];
  char acStack_128 [272];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if ((text != (char16_t *)0x0 && file != (char16_t *)0x0) && (*file != 0)) {
      lVar4 = 1;
      do {
        pcVar1 = file + lVar4;
        lVar4 = lVar4 + 1;
      } while (*pcVar1 != 0);
      if ((lVar4 != 1) && (*text != 0)) {
        lVar4 = 1;
        do {
          pcVar1 = text + lVar4;
          lVar4 = lVar4 + 1;
        } while (*pcVar1 != 0);
        if (lVar4 != 1) {
          pcVar5 = convert_charset_path((char *)file,CS_UTF_16LE,acStack_128,CS_UTF_8);
          if (pcVar5 == (char *)0x0) {
            return false;
          }
          __stream = fopen(acStack_128,"wb");
          if (__stream != (FILE *)0x0) {
            pcVar5 = convert_charset((char *)text,CS_UTF_16LE,CS_UTF_8);
            pSVar2 = g_psd;
            if (pcVar5 == (char *)0x0) {
              return false;
            }
            g_psd->sampling_frequency = 0;
            pSVar2->data = (short *)0x0;
            pSVar2->length = 0;
            _Var3 = Open_JTalk_synthesis(oj->open_jtalk,pcVar5,(FILE *)__stream,(FILE *)0x0);
            free(pcVar5);
            fclose(__stream);
            return _Var3;
          }
          oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
          return false;
        }
      }
    }
    oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFileU16(OpenJTalk *oj, const char16_t *text, const char16_t *file)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}
	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (file == NULL || text == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlenU16(file) == 0 || strlenU16(text) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	FILE *wavfp = _wfopen((wchar_t *)file, u"wb");
#else
	char pathU8[MAX_PATH];
	if (!u16tou8_path(file, pathU8))
	{
		return false;
	}
	FILE *wavfp = fopen(pathU8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	char *buf = u16tou8(text);
	if (!buf)
	{
		return false;
	}
	bool result = generate_wavFile(oj, buf, wavfp);
	if (buf)
	{
		free(buf);
	}
	fclose(wavfp);
	return result;
}